

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unix-sockets.c
# Opt level: O3

int lws_interface_to_sa(int ipv6,char *ifname,sockaddr_in *addr,size_t addrlen)

{
  short *psVar1;
  in_addr_t iVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  short sVar5;
  int iVar6;
  int iVar7;
  long *in_RAX;
  uint *puVar8;
  long *plVar9;
  ifaddrs *ifr;
  long *local_38;
  
  local_38 = in_RAX;
  iVar6 = getifaddrs(&local_38);
  if (iVar6 == 0) {
    iVar6 = -1;
    plVar9 = local_38;
    if (local_38 == (long *)0x0) {
      local_38 = (long *)0x0;
    }
    else {
      do {
        if (((ushort *)plVar9[3] != (ushort *)0x0) && (plVar9[1] != 0)) {
          _lws_log(0x10," interface %s vs %s (fam %d) ipv6 %d\n",plVar9[1],ifname,
                   (ulong)*(ushort *)plVar9[3],ipv6);
          iVar7 = strcmp((char *)plVar9[1],ifname);
          if (iVar7 == 0) {
            psVar1 = (short *)plVar9[3];
            if (*psVar1 == 0x11) {
              iVar6 = -2;
            }
            else if (*psVar1 == 2) {
              sVar5 = psVar1[1];
              iVar2 = *(in_addr_t *)(psVar1 + 2);
              uVar3 = *(undefined4 *)(psVar1 + 4);
              uVar4 = *(undefined4 *)(psVar1 + 6);
              addr->sin_family = psVar1[0];
              addr->sin_port = sVar5;
              (addr->sin_addr).s_addr = iVar2;
              *(undefined4 *)addr->sin_zero = uVar3;
              *(undefined4 *)(addr->sin_zero + 4) = uVar4;
              freeifaddrs(local_38);
              return 0;
            }
          }
        }
        plVar9 = (long *)*plVar9;
      } while (plVar9 != (long *)0x0);
    }
    freeifaddrs(local_38);
    iVar7 = lws_sa46_parse_numeric_address(ifname,(lws_sockaddr46 *)addr);
    if (iVar7 == 0) {
      iVar6 = 0;
    }
  }
  else {
    puVar8 = (uint *)__errno_location();
    iVar6 = 0;
    _lws_log(1,"%s: unable to getifaddrs: errno %d\n","lws_interface_to_sa",(ulong)*puVar8);
  }
  return iVar6;
}

Assistant:

int
lws_interface_to_sa(int ipv6, const char *ifname, struct sockaddr_in *addr,
		    size_t addrlen)
{
	int rc = LWS_ITOSA_NOT_EXIST;

	struct ifaddrs *ifr;
	struct ifaddrs *ifc;
#ifdef LWS_WITH_IPV6
	struct sockaddr_in6 *addr6 = (struct sockaddr_in6 *)addr;
#endif

	if (getifaddrs(&ifr)) {
		lwsl_err("%s: unable to getifaddrs: errno %d\n", __func__, errno);

		return LWS_ITOSA_USABLE;
	}
	for (ifc = ifr; ifc != NULL && rc; ifc = ifc->ifa_next) {
		if (!ifc->ifa_addr || !ifc->ifa_name)
			continue;

		lwsl_debug(" interface %s vs %s (fam %d) ipv6 %d\n",
			   ifc->ifa_name, ifname,
			   ifc->ifa_addr->sa_family, ipv6);

		if (strcmp(ifc->ifa_name, ifname))
			continue;

		switch (ifc->ifa_addr->sa_family) {
#if defined(AF_PACKET)
		case AF_PACKET:
			/* interface exists but is not usable */
			rc = LWS_ITOSA_NOT_USABLE;
			continue;
#endif

		case AF_INET:
#ifdef LWS_WITH_IPV6
			if (ipv6) {
				/* map IPv4 to IPv6 */
				memset((char *)&addr6->sin6_addr, 0,
						sizeof(struct in6_addr));
				addr6->sin6_addr.s6_addr[10] = 0xff;
				addr6->sin6_addr.s6_addr[11] = 0xff;
				memcpy(&addr6->sin6_addr.s6_addr[12],
				       &((struct sockaddr_in *)ifc->ifa_addr)->sin_addr,
							sizeof(struct in_addr));
				lwsl_debug("%s: uplevelling ipv4 bind to ipv6\n", __func__);
			} else
#endif
				memcpy(addr,
					(struct sockaddr_in *)ifc->ifa_addr,
						    sizeof(struct sockaddr_in));
			break;
#ifdef LWS_WITH_IPV6
		case AF_INET6:
			memcpy(&addr6->sin6_addr,
			  &((struct sockaddr_in6 *)ifc->ifa_addr)->sin6_addr,
						       sizeof(struct in6_addr));
			break;
#endif
		default:
			continue;
		}
		rc = LWS_ITOSA_USABLE;
	}

	freeifaddrs(ifr);

	if (rc &&
	    !lws_sa46_parse_numeric_address(ifname, (lws_sockaddr46 *)addr))
		rc = LWS_ITOSA_USABLE;

	return rc;
}